

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator iVar1;
  pair<int,_int> pVar2;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer *__ptr;
  pointer ppVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  size_type expected_bucknum;
  AssertionResult gtest_ar;
  pair<int,_int> local_88;
  pair<int,_int> local_80;
  size_type local_78;
  pair<google::sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_70;
  
  pVar2 = UniqueObjectHelper<std::pair<int,int>>(1);
  local_70.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)(uint)-pVar2.first - ((ulong)pVar2 & 0xffffffff00000000));
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  pVar4 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_70);
  local_78 = pVar4.second;
  if (pVar4.first != 0xffffffffffffffff) {
    local_78 = pVar4.first;
  }
  local_80 = (pair<int,_int>)((ulong)(uint)local_80.second << 0x20);
  local_88 = (pair<int,_int>)
             google::
             sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::bucket_size(this_00,local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"0u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_80,
             (unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x254,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_88 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_88 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_70,this_00,&local_88);
  pVar2 = UniqueObjectHelper<std::pair<int,int>>(1);
  local_80 = (pair<int,_int>)((ulong)(uint)-pVar2.first - ((ulong)pVar2 & 0xffffffff00000000));
  pVar4 = google::
          sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,&local_80);
  local_88 = (pair<int,_int>)pVar4.second;
  if ((pair<int,_int>)pVar4.first != (pair<int,_int>)0xffffffffffffffff) {
    local_88 = (pair<int,_int>)pVar4.first;
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"expected_bucknum","this->ht_.bucket(this->UniqueKey(1))",
             &local_78,(unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,599,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_88 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_80.first = 1;
  local_88 = (pair<int,_int>)
             google::
             sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::bucket_size(this_00,local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"1u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_80,
             (unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,600,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_88 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_80 = (pair<int,_int>)((ulong)local_80 & 0xffffffff00000000);
  local_88 = (pair<int,_int>)
             google::
             sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::bucket_size(this_00,local_78 ^ 1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"0u","this->ht_.bucket_size(expected_bucknum ^ 1)",
             (uint *)&local_80,(unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x25c,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_88 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(local_70.first.pos.row_begin._M_current);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}